

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Spatializer.cpp
# Opt level: O2

int Spatializer::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  InstanceChannel *h;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  UnityAudioSpatializerData *pUVar5;
  int n;
  EffectData *pEVar6;
  float *pfVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  UnityComplexNumberT<float> *result;
  UnityComplexNumberT<float> *pUVar11;
  long lVar12;
  uint uVar13;
  float *pfVar14;
  float *pfVar15;
  EffectData *pEVar16;
  bool bVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float __x;
  float __y;
  float spreadmatrix [2];
  
  if ((((outchannels != 2 || inchannels != 2) || ((state->field_0).field_0.structsize < 0x50)) ||
      ((state->field_0).field_0.hostapiversion < 0x10300)) ||
     ((state->field_0).field_0.spatializerdata == (UnityAudioSpatializerData *)0x0)) {
    memcpy(outbuffer,inbuffer,(ulong)(outchannels * length) << 2);
    return 0;
  }
  pEVar6 = UnityAudioEffectState::GetEffectData<Spatializer::EffectData>(state);
  pUVar5 = (state->field_0).field_0.spatializerdata;
  fVar1 = pUVar5->sourcematrix[0xc];
  fVar2 = pUVar5->sourcematrix[0xd];
  fVar19 = pUVar5->sourcematrix[0xe];
  __y = pUVar5->listenermatrix[8] * fVar19 +
        pUVar5->listenermatrix[0] * fVar1 + pUVar5->listenermatrix[4] * fVar2 +
        pUVar5->listenermatrix[0xc];
  fVar20 = pUVar5->listenermatrix[5];
  fVar21 = pUVar5->listenermatrix[1];
  fVar3 = pUVar5->listenermatrix[9];
  fVar4 = pUVar5->listenermatrix[0xd];
  __x = fVar19 * pUVar5->listenermatrix[10] +
        fVar1 * pUVar5->listenermatrix[2] + fVar2 * pUVar5->listenermatrix[6] +
        pUVar5->listenermatrix[0xe];
  fVar18 = 0.0;
  if (0.001 <= ABS(__x)) {
    fVar18 = atan2f(__y,__x);
  }
  fVar18 = (float)(~-(uint)(fVar18 < 0.0) & (uint)fVar18 |
                  (uint)(fVar18 + 6.2831855) & -(uint)(fVar18 < 0.0)) * 57.295776;
  fVar18 = ((ABS(fVar18) - ABS(fVar18 + -360.0)) + 360.0) * 0.5;
  fVar19 = atan2f(fVar3 * fVar19 + fVar21 * fVar1 + fVar20 * fVar2 + fVar4,
                  SQRT(__y * __y + __x * __x) + 0.001);
  pUVar5 = (state->field_0).field_0.spatializerdata;
  fVar1 = pUVar5->spatialblend;
  fVar2 = pUVar5->reverbzonemix;
  h = pEVar6->ch;
  uVar13 = 0;
  GetHRTF(0,h->h,fVar18,fVar19 * 57.295776);
  GetHRTF(1,pEVar6->ch[1].h,fVar18,fVar19 * 57.295776);
  spreadmatrix[1] = cosf((((state->field_0).field_0.spatializerdata)->spread * 3.1415927) / 360.0);
  spreadmatrix[0] = 2.0 - spreadmatrix[1];
  pfVar7 = reverbmixbuffer;
LAB_00115f65:
  if (length <= uVar13) {
    return 0;
  }
  lVar12 = 0;
  pfVar9 = inbuffer;
  pfVar10 = outbuffer;
  pUVar11 = pEVar6->ch[0].y;
  pfVar14 = pfVar7;
  pfVar15 = pEVar6->ch[0].buffer + 0x200;
  pEVar16 = pEVar6;
  do {
    if (lVar12 == 0) {
      fVar20 = ((state->field_0).field_0.spatializerdata)->stereopan;
      fVar19 = 0.0 - fVar20;
      fVar20 = fVar20 + 0.0;
    }
    else {
      if (lVar12 == 2) break;
      fVar19 = ((state->field_0).field_0.spatializerdata)->stereopan;
      fVar20 = 0.0 - fVar19;
      fVar19 = fVar19 + 0.0;
    }
    fVar21 = spreadmatrix[lVar12];
    fVar3 = *(float *)((long)spreadmatrix + (ulong)(uint)((1 - (int)lVar12) * 4));
    for (lVar8 = 0; lVar8 != 0x200; lVar8 = lVar8 + 1) {
      fVar4 = inbuffer[lVar8 * 2 + 1];
      fVar18 = inbuffer[lVar8 * 2];
      pfVar15[lVar8 + -0x200] = pfVar15[lVar8];
      pfVar15[lVar8] = fVar18 * fVar21 + fVar4 * fVar3;
    }
    for (lVar8 = 0x1803; lVar8 != 0x1c03; lVar8 = lVar8 + 1) {
      *(float *)((long)pEVar16 + lVar8 * 8 + -0xa00c) = pEVar16->p[lVar8];
      *(undefined4 *)((long)pEVar16 + lVar8 * 8 + -0xa008) = 0;
    }
    FFT::Forward(h[lVar12].x,0x400,false);
    lVar8 = 0x400;
    result = pUVar11;
    while (bVar17 = lVar8 != 0, lVar8 = lVar8 + -1, bVar17) {
      UnityComplexNumberT<float>::Mul<float,float,float>(result + -0x400,result + -0x800,result);
      result = result + 1;
    }
    FFT::Backward(h[lVar12].y,0x400,false);
    for (lVar8 = 0; lVar8 != 0x200; lVar8 = lVar8 + 1) {
      fVar21 = pfVar9[lVar8 * 2] * (1.0 - (ABS(fVar19) + fVar20) * 0.5);
      fVar21 = ((pUVar11[lVar8].re + pUVar11[lVar8].re) - fVar21) * fVar1 + fVar21;
      pfVar10[lVar8 * 2] = fVar21;
      pfVar14[lVar8 * 2] = fVar21 * fVar2 + pfVar14[lVar8 * 2];
    }
    lVar12 = lVar12 + 1;
    pfVar15 = pfVar15 + 0x1c00;
    pEVar16 = (EffectData *)(pEVar16->ch[0].buffer + 0x3fd);
    pUVar11 = pUVar11 + 0xe00;
    pfVar14 = pfVar14 + 1;
    pfVar10 = pfVar10 + 1;
    pfVar9 = pfVar9 + 1;
  } while( true );
  inbuffer = inbuffer + 0x400;
  outbuffer = outbuffer + 0x400;
  pfVar7 = pfVar7 + 0x400;
  uVar13 = uVar13 + 0x200;
  goto LAB_00115f65;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        // Check that I/O formats are right and that the host API supports this feature
        if (inchannels != 2 || outchannels != 2 ||
            !IsHostCompatible(state) || state->spatializerdata == NULL)
        {
            memcpy(outbuffer, inbuffer, length * outchannels * sizeof(float));
            return UNITY_AUDIODSP_OK;
        }

        EffectData* data = state->GetEffectData<EffectData>();

        static const float kRad2Deg = 180.0f / kPI;

        float* m = state->spatializerdata->listenermatrix;
        float* s = state->spatializerdata->sourcematrix;

        // Currently we ignore source orientation and only use the position
        float px = s[12];
        float py = s[13];
        float pz = s[14];

        float dir_x = m[0] * px + m[4] * py + m[8] * pz + m[12];
        float dir_y = m[1] * px + m[5] * py + m[9] * pz + m[13];
        float dir_z = m[2] * px + m[6] * py + m[10] * pz + m[14];

        float azimuth = (fabsf(dir_z) < 0.001f) ? 0.0f : atan2f(dir_x, dir_z);
        if (azimuth < 0.0f)
            azimuth += 2.0f * kPI;
        azimuth = FastClip(azimuth * kRad2Deg, 0.0f, 360.0f);

        float elevation = atan2f(dir_y, sqrtf(dir_x * dir_x + dir_z * dir_z) + 0.001f) * kRad2Deg;
        float spatialblend = state->spatializerdata->spatialblend;
        float reverbmix = state->spatializerdata->reverbzonemix;

        GetHRTF(0, data->ch[0].h, azimuth, elevation);
        GetHRTF(1, data->ch[1].h, azimuth, elevation);

        // From the FMOD documentation:
        //   A spread angle of 0 makes the stereo sound mono at the point of the 3D emitter.
        //   A spread angle of 90 makes the left part of the stereo sound place itself at 45 degrees to the left and the right part 45 degrees to the right.
        //   A spread angle of 180 makes the left part of the stero sound place itself at 90 degrees to the left and the right part 90 degrees to the right.
        //   A spread angle of 360 makes the stereo sound mono at the opposite speaker location to where the 3D emitter should be located (by moving the left part 180 degrees left and the right part 180 degrees right). So in this case, behind you when the sound should be in front of you!
        // Note that FMOD performs the spreading and panning in one go. We can't do this here due to the way that impulse-based spatialization works, so we perform the spread calculations on the left/right source signals before they enter the convolution processing.
        // That way we can still use it to control how the source signal downmixing takes place.
        float spread = cosf(state->spatializerdata->spread * kPI / 360.0f);
        float spreadmatrix[2] = { 2.0f - spread, spread };

        float* reverb = reverbmixbuffer;
        for (int sampleOffset = 0; sampleOffset < length; sampleOffset += HRTFLEN)
        {
            for (int c = 0; c < 2; c++)
            {
                // stereopan is in the [-1; 1] range, this acts the way fmod does it for stereo
                float stereopan = 1.0f - ((c == 0) ? FastMax(0.0f, state->spatializerdata->stereopan) : FastMax(0.0f, -state->spatializerdata->stereopan));

                InstanceChannel& ch = data->ch[c];

                for (int n = 0; n < HRTFLEN; n++)
                {
                    float left  = inbuffer[n * 2];
                    float right = inbuffer[n * 2 + 1];
                    ch.buffer[n] = ch.buffer[n + HRTFLEN];
                    ch.buffer[n + HRTFLEN] = left * spreadmatrix[c] + right * spreadmatrix[1 - c];
                }

                for (int n = 0; n < HRTFLEN * 2; n++)
                {
                    ch.x[n].re = ch.buffer[n];
                    ch.x[n].im = 0.0f;
                }

                FFT::Forward(ch.x, HRTFLEN * 2, false);

                for (int n = 0; n < HRTFLEN * 2; n++)
                    UnityComplexNumber::Mul<float, float, float>(ch.x[n], ch.h[n], ch.y[n]);

                FFT::Backward(ch.y, HRTFLEN * 2, false);

                for (int n = 0; n < HRTFLEN; n++)
                {
                    float s = inbuffer[n * 2 + c] * stereopan;
                    float y = s + (ch.y[n].re * GAINCORRECTION - s) * spatialblend;
                    outbuffer[n * 2 + c] = y;
                    reverb[n * 2 + c] += y * reverbmix;
                }
            }

            inbuffer += HRTFLEN * 2;
            outbuffer += HRTFLEN * 2;
            reverb += HRTFLEN * 2;
        }

        return UNITY_AUDIODSP_OK;
    }